

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O1

void __thiscall Fl_Pixmap::delete_data(Fl_Pixmap *this)

{
  char *pcVar1;
  char **ppcVar2;
  long lVar3;
  
  if (this->alloc_data != 0) {
    if (0 < (this->super_Fl_Image).count_) {
      lVar3 = 0;
      do {
        pcVar1 = (this->super_Fl_Image).data_[lVar3];
        if (pcVar1 != (char *)0x0) {
          operator_delete__(pcVar1);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (this->super_Fl_Image).count_);
    }
    ppcVar2 = (this->super_Fl_Image).data_;
    if (ppcVar2 != (char **)0x0) {
      operator_delete__(ppcVar2);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Pixmap::delete_data() {
  if (alloc_data) {
    for (int i = 0; i < count(); i ++) delete[] (char *)data()[i];
    delete[] (char **)data();
  }
}